

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getFuncFromIdx
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,uint32_t idx)

{
  pointer puVar1;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var2;
  undefined8 uVar3;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)idx <
      (ulong)((long)(this->wasm->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var2._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         puVar1[idx]._M_t.
         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
    uVar3 = *(undefined8 *)
             ((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err> =
         *(undefined8 *)
          _Var2._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = uVar3;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"function index out of bounds",&local_21);
    Lexer::err(&local_48,&this->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Name,wasm::Err> *)__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getFuncFromIdx(uint32_t idx) {
    if (idx >= wasm.functions.size()) {
      return in.err("function index out of bounds");
    }
    return wasm.functions[idx]->name;
  }